

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asterism_connector_tcp.c
# Opt level: O2

void heartbeat_timeout_cb(uv_timer_t *handle)

{
  asterism_stream_s *stream;
  int iVar1;
  asterism_trans_proto_s *base;
  uv_write_t *req;
  uv_buf_t uVar2;
  
  if (handle[1].data != (void *)0x0) {
    iVar1 = uv_is_closing((uv_handle_t *)((long)handle[1].data + 8));
    if (iVar1 == 0) {
      stream = (asterism_stream_s *)handle[1].data;
      base = (asterism_trans_proto_s *)malloc(4);
      *base = _global_proto_ping;
      req = (uv_write_t *)calloc(1,0xd0);
      uVar2 = uv_buf_init((char *)base,4);
      *(uv_buf_t *)(req + 1) = uVar2;
      req->data = stream;
      iVar1 = asterism_stream_write(req,stream,(uv_buf_t *)(req + 1),connector_send_ping_cb);
      if (iVar1 != 0) {
        asterism_stream_close((uv_handle_t *)handle);
        return;
      }
    }
  }
  return;
}

Assistant:

static void heartbeat_timeout_cb(
    uv_timer_t *handle)
{
    struct connector_timer_s *timer = __CONTAINER_PTR(struct connector_timer_s, timer, handle);
    if (!timer->connector || uv_is_closing((uv_handle_t *)&timer->connector->socket))
    {
        return;
    }
    int ret = connector_send_ping(timer->connector);
    if (ret != 0)
        asterism_stream_close((uv_handle_t *)handle);
}